

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

void __thiscall
capnp::SchemaLoader::Validator::validateTypeId(Validator *this,uint64_t id,Which expectedKind)

{
  Impl *this_00;
  RawSchema *value;
  char (*in_R8) [2];
  StringPtr name;
  Which expectedKind_local;
  uint local_b4;
  uint64_t id_local;
  uint local_a4;
  DebugComparison<capnp::schema::Node::Which,_capnp::schema::Node::Which_&> _kjCondition;
  Reader node;
  Fault f;
  ArrayPtr<const_char> local_40;
  
  expectedKind_local = expectedKind;
  id_local = id;
  SchemaLoader::Impl::tryGet((Impl *)&node,(uint64_t)this->loader);
  if (node._reader.segment == (SegmentReader *)0x0) {
    this_00 = this->loader;
    kj::str<char_const(&)[23],capnp::Text::Reader&,char_const(&)[2]>
              ((String *)&node,(kj *)"(unknown type used by ",(char (*) [23])&this->nodeName,
               (Reader *)0x44ec57,in_R8);
    if (node._reader.capTable == (CapTableReader *)0x0) {
      node._reader.segment = (SegmentReader *)0x4706a1;
    }
    name.content.size_ =
         (long)&(node._reader.capTable)->_vptr_CapTableReader +
         (ulong)(node._reader.capTable == (CapTableReader *)0x0);
    name.content.ptr = (char *)node._reader.segment;
    value = SchemaLoader::Impl::loadEmpty(this_00,id,name,expectedKind,true);
    kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::
    upsert<capnp::SchemaLoader::Validator::validateTypeId(unsigned_long,capnp::schema::Node::Which)::_lambda(auto:1&,auto:2&&)_2_>
              ((TreeMap<unsigned_long,capnp::_::RawSchema*> *)&this->dependencies,id,value,
               (anon_class_1_0_00000001 *)&_kjCondition);
    kj::Array<char>::~Array((Array<char> *)&node);
  }
  else {
    readMessageUnchecked<capnp::schema::Node>(&node,*(word **)&(node._reader.segment)->id);
    if (node._reader.dataSize < 0x70) {
      _kjCondition.left = FILE;
    }
    else {
      _kjCondition.left = *(Which *)((long)node._reader.data + 0xc);
    }
    _kjCondition.right = &expectedKind_local;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = _kjCondition.left == expectedKind;
    if (_kjCondition.result) {
      kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::
      upsert<capnp::SchemaLoader::Validator::validateTypeId(unsigned_long,capnp::schema::Node::Which)::_lambda(auto:1&,auto:2&&)_1_>
                ((TreeMap<unsigned_long,capnp::_::RawSchema*> *)&this->dependencies,id,
                 (RawSchema *)node._reader.segment,(anon_class_1_0_00000001 *)&_kjCondition);
    }
    else {
      local_a4 = 0;
      local_b4 = (uint)expectedKind;
      if (0x6f < node._reader.dataSize) {
        local_a4 = (uint)*(ushort *)((long)node._reader.data + 0xc);
      }
      local_40 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&node);
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::schema::Node::Which,capnp::schema::Node::Which&>&,char_const(&)[46],unsigned_long&,unsigned_int,unsigned_int,capnp::Text::Reader>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x260,FAILED,"node.which() == expectedKind",
                 "_kjCondition,\"expected a different kind of node for this ID\", id, (uint)expectedKind, (uint)node.which(), node.getDisplayName()"
                 ,&_kjCondition,(char (*) [46])"expected a different kind of node for this ID",
                 &id_local,&local_b4,&local_a4,(Reader *)&local_40);
      this->isValid = false;
      kj::_::Debug::Fault::~Fault(&f);
    }
  }
  return;
}

Assistant:

void validateTypeId(uint64_t id, schema::Node::Which expectedKind) {
    _::RawSchema* existing = loader.tryGet(id).schema;
    if (existing != nullptr) {
      auto node = readMessageUnchecked<schema::Node>(existing->encodedNode);
      VALIDATE_SCHEMA(node.which() == expectedKind,
          "expected a different kind of node for this ID",
          id, (uint)expectedKind, (uint)node.which(), node.getDisplayName());
      dependencies.upsert(id, existing, [](auto&,auto&&) { /* ignore dupe */ });
      return;
    }

    dependencies.upsert(id, loader.loadEmpty(
        id, kj::str("(unknown type used by ", nodeName , ")"), expectedKind, true),
        [](auto&,auto&&) { /* ignore dupe */ });
  }